

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

Result ONX_ModelTest::ResultFromErrorCounter(ONX_ErrorCounter error_count,Result no_errors_result)

{
  Result RVar1;
  
  RVar1 = Fail;
  if ((error_count.m_failure_count == 0) && (RVar1 = Errors, error_count.m_error_count == 0)) {
    RVar1 = Warnings;
    if (error_count.m_warning_count == 0) {
      RVar1 = no_errors_result;
    }
    return RVar1;
  }
  return RVar1;
}

Assistant:

ONX_ModelTest::Result ONX_ModelTest::ResultFromErrorCounter(
  ONX_ErrorCounter error_count,
  ONX_ModelTest::Result no_errors_result
)
{
  if (error_count.FailureCount() > 0)
    return ONX_ModelTest::Result::Fail;
  if (error_count.ErrorCount() > 0)
    return ONX_ModelTest::Result::Errors;
  if (error_count.WarningCount() > 0)
    return ONX_ModelTest::Result::Warnings;
  return no_errors_result;
}